

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

char * CVmObjString::find_substr
                 (vm_val_t *strval,char *basestr,char *str,size_t len,char *substr,
                 CVmObjPattern *pat,int *match_idx,int *match_len)

{
  vm_globalvar_t *pvVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  re_compiled_pattern *result_len;
  ulong in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  CRegexSearcherSimple *in_R8;
  re_compiled_pattern *in_R9;
  int *in_stack_00000008;
  int idx;
  re_compiled_pattern *cpat;
  int i;
  utf8_ptr p;
  size_t sublen;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  utf8_ptr in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *__s2;
  
  if (in_R8 == (CRegexSearcherSimple *)0x0) {
    if (in_R9 != (re_compiled_pattern *)0x0) {
      result_len = CVmObjPattern::get_pattern((CVmObjPattern *)0x33f2df);
      pvVar1 = G_bif_tads_globals_X->last_rex_str;
      *(undefined8 *)&pvVar1->val = *in_RDI;
      (pvVar1->val).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDI + 1);
      CRegexSearcherSimple::clear_group_regs((CRegexSearcherSimple *)0x33f318);
      iVar5 = CRegexSearcherSimple::search_for_pattern
                        (in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8.p_,
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (int *)result_len);
      if (-1 < iVar5) {
        sVar3 = utf8_ptr::s_len((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                                                ),(size_t)result_len);
        *in_stack_00000008 = (int)sVar3;
        return (char *)(in_RDX + iVar5);
      }
    }
  }
  else {
    sVar3 = vmb_get_len((char *)0x33f222);
    __s2 = (void *)((long)&(in_R8->super_CRegexSearcher).stack_.buf_ + 2);
    utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    iVar5 = 0;
    while (sVar3 <= in_RCX) {
      pcVar4 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb8);
      iVar2 = memcmp(pcVar4,__s2,sVar3);
      if (iVar2 == 0) {
        *in_stack_00000008 = iVar5;
        (cpat->super_re_compiled_pattern_base).machine.init = (re_state_id)sVar3;
        pcVar4 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffb8);
        return pcVar4;
      }
      utf8_ptr::inc((utf8_ptr *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8)
      ;
      iVar5 = iVar5 + 1;
    }
  }
  *in_stack_00000008 = -1;
  (cpat->super_re_compiled_pattern_base).machine.init = 0;
  return (char *)0x0;
}

Assistant:

const char *CVmObjString::find_substr(
    VMG_ const vm_val_t *strval,
    const char *basestr, const char *str, size_t len,
    const char *substr, CVmObjPattern *pat, int *match_idx, int *match_len)
{
    /* search for the string or pattern */
    if (substr != 0)
    {
        /* get the substring length and buffer pointer */
        size_t sublen = vmb_get_len(substr);
        substr += VMB_LEN;

        /* search for the substring */
        utf8_ptr p((char *)str);
        for (int i = 0 ; len >= sublen ; p.inc(&len), ++i)
        {
            /* check for a match */
            if (memcmp(p.getptr(), substr, sublen) == 0)
            {
                /* got it - the match length is simply the substring length */
                *match_idx = i;
                *match_len = sublen;
                return p.getptr();
            }
        }
    }
    else if (pat != 0)
    {
        /* get the compiled pattern */
        re_compiled_pattern *cpat = pat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *strval;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* search for the pattern */
        int idx = G_bif_tads_globals->rex_searcher->search_for_pattern(
            cpat, basestr, str, len, match_len);

        /* if we found the match, return it */
        if (idx >= 0)
        {
            /* set the match index and length */
            *match_idx = utf8_ptr::s_len(str, idx);
            return str + idx;
        }
    }

    /* no match */
    *match_idx = -1;
    *match_len = 0;
    return 0;
}